

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cpp
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_1ba5289::ConstPubkeyProvider::GetPubKey
          (ConstPubkeyProvider *this,int pos,SigningProvider *arg,CPubKey *key,KeyOriginInfo *info,
          DescriptorCache *read_cache,DescriptorCache *write_cache)

{
  long lVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_00;
  uchar *__result;
  CPubKey *in_RCX;
  long in_RDI;
  uchar *in_R8;
  uchar *in_R9;
  long in_FS_OFFSET;
  CKeyID keyid;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 0xc);
  in_RCX->vch[0x40] = *(uchar *)(in_RDI + 0x4c);
  uVar2 = *(undefined8 *)(in_RDI + 0xc);
  uVar3 = *(undefined8 *)(in_RDI + 0x14);
  uVar4 = *(undefined8 *)(in_RDI + 0x1c);
  uVar5 = *(undefined8 *)(in_RDI + 0x24);
  uVar6 = *(undefined8 *)(in_RDI + 0x2c);
  uVar7 = *(undefined8 *)(in_RDI + 0x34);
  uVar8 = *(undefined8 *)(in_RDI + 0x44);
  *(undefined8 *)(in_RCX->vch + 0x30) = *(undefined8 *)(in_RDI + 0x3c);
  *(undefined8 *)(in_RCX->vch + 0x38) = uVar8;
  *(undefined8 *)(in_RCX->vch + 0x20) = uVar6;
  *(undefined8 *)(in_RCX->vch + 0x28) = uVar7;
  *(undefined8 *)(in_RCX->vch + 0x10) = uVar4;
  *(undefined8 *)(in_RCX->vch + 0x18) = uVar5;
  *(undefined8 *)in_RCX->vch = uVar2;
  *(undefined8 *)(in_RCX->vch + 8) = uVar3;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::clear(this_00);
  CPubKey::GetID(in_RCX);
  __result = base_blob<160U>::begin((base_blob<160U> *)this_00);
  base_blob<160U>::begin((base_blob<160U> *)this_00);
  std::copy<unsigned_char*,unsigned_char*>(in_R8,in_R9,__result);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return true;
  }
  __stack_chk_fail();
}

Assistant:

bool GetPubKey(int pos, const SigningProvider& arg, CPubKey& key, KeyOriginInfo& info, const DescriptorCache* read_cache = nullptr, DescriptorCache* write_cache = nullptr) const override
    {
        key = m_pubkey;
        info.path.clear();
        CKeyID keyid = m_pubkey.GetID();
        std::copy(keyid.begin(), keyid.begin() + sizeof(info.fingerprint), info.fingerprint);
        return true;
    }